

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_decompress1X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 int flags)

{
  byte bVar1;
  byte bVar2;
  BIT_DStream_status BVar3;
  size_t sVar4;
  uint uVar5;
  uint nbBits;
  undefined1 *puVar6;
  bool bVar7;
  BIT_DStream_t BStack_70;
  size_t sStack_48;
  undefined1 *puStack_40;
  undefined1 *puStack_38;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar4 = HUF_decompress1X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,flags);
    return sVar4;
  }
  bVar1 = *(byte *)((long)DTable + 2);
  nbBits = (uint)bVar1;
  sStack_48 = BIT_initDStream(&BStack_70,cSrc,cSrcSize);
  if (sStack_48 < 0xffffffffffffff89) {
    puVar6 = (undefined1 *)((long)dst + maxDstSize);
    sStack_48 = maxDstSize;
    if ((long)maxDstSize < 4) {
      if (BStack_70.bitsConsumed < 0x41) {
        if (BStack_70.ptr < BStack_70.limitPtr) {
          if (BStack_70.ptr != BStack_70.start) {
            uVar5 = (int)BStack_70.ptr - (int)BStack_70.start;
            if (BStack_70.start <=
                (size_t *)((long)BStack_70.ptr - (ulong)(BStack_70.bitsConsumed >> 3))) {
              uVar5 = BStack_70.bitsConsumed >> 3;
            }
            BStack_70.ptr = (char *)((long)BStack_70.ptr - (ulong)uVar5);
            BStack_70.bitsConsumed = BStack_70.bitsConsumed + uVar5 * -8;
            BStack_70.bitContainer = *(size_t *)BStack_70.ptr;
          }
        }
        else {
          BIT_reloadDStreamFast(&BStack_70);
        }
      }
    }
    else {
      puStack_38 = puVar6 + -3;
      puStack_40 = puVar6;
      while (BStack_70.bitsConsumed < 0x41) {
        if (BStack_70.ptr < BStack_70.limitPtr) {
          if (BStack_70.ptr == BStack_70.start) break;
          bVar7 = (size_t *)((long)BStack_70.ptr - (ulong)(BStack_70.bitsConsumed >> 3)) <
                  BStack_70.start;
          uVar5 = (int)BStack_70.ptr - (int)BStack_70.start;
          if (!bVar7) {
            uVar5 = BStack_70.bitsConsumed >> 3;
          }
          BVar3 = (BIT_DStream_status)bVar7;
          BStack_70.ptr = (char *)((long)BStack_70.ptr - (ulong)uVar5);
          BStack_70.bitsConsumed = BStack_70.bitsConsumed + uVar5 * -8;
          BStack_70.bitContainer = *(size_t *)BStack_70.ptr;
        }
        else {
          BVar3 = BIT_reloadDStreamFast(&BStack_70);
        }
        if ((puStack_38 <= dst) || (BVar3 != BIT_DStream_unfinished)) break;
        sVar4 = BIT_lookBitsFast(&BStack_70,(uint)bVar1);
        uVar5 = *(byte *)((long)DTable + sVar4 * 2 + 4) + BStack_70.bitsConsumed;
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + sVar4 * 2 + 5);
        BStack_70.bitsConsumed = uVar5;
        sVar4 = BIT_lookBitsFast(&BStack_70,(uint)bVar1);
        uVar5 = *(byte *)((long)DTable + sVar4 * 2 + 4) + uVar5;
        *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + sVar4 * 2 + 5);
        BStack_70.bitsConsumed = uVar5;
        sVar4 = BIT_lookBitsFast(&BStack_70,nbBits);
        puVar6 = puStack_40;
        uVar5 = *(byte *)((long)DTable + sVar4 * 2 + 4) + uVar5;
        *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + sVar4 * 2 + 5);
        BStack_70.bitsConsumed = uVar5;
        sVar4 = BIT_lookBitsFast(&BStack_70,nbBits);
        bVar2 = *(byte *)((long)DTable + sVar4 * 2 + 4);
        *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + sVar4 * 2 + 5);
        dst = (void *)((long)dst + 4);
        BStack_70.bitsConsumed = bVar2 + uVar5;
      }
    }
    for (; dst < puVar6; dst = (void *)((long)dst + 1)) {
      sVar4 = BIT_lookBitsFast(&BStack_70,nbBits);
      BStack_70.bitsConsumed = BStack_70.bitsConsumed + *(byte *)((long)DTable + sVar4 * 2 + 4);
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + sVar4 * 2 + 5);
    }
    if (BStack_70.bitsConsumed != 0x40) {
      sStack_48 = 0xffffffffffffffec;
    }
    if (BStack_70.ptr != BStack_70.start) {
      sStack_48 = 0xffffffffffffffec;
    }
  }
  return sStack_48;
}

Assistant:

size_t HUF_decompress1X_usingDTable(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int flags)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#else
    return dtd.tableType ? HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags) :
                           HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#endif
}